

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::ValueExpressionBase::checkConstantBase(ValueExpressionBase *this,EvalContext *context)

{
  SourceRange *pSVar1;
  bool bVar2;
  Type *pTVar3;
  bitmask<slang::ast::EvalFlags> *this_00;
  byte local_71;
  bitmask<slang::ast::EvalFlags> local_51;
  SourceLocation local_50;
  SourceLocation local_48;
  undefined4 local_3c;
  SourceLocation local_38;
  SourceLocation local_30;
  undefined4 local_24;
  EvalContext *local_20;
  EvalContext *context_local;
  ValueExpressionBase *this_local;
  
  local_20 = context;
  context_local = (EvalContext *)this;
  pTVar3 = not_null<const_slang::ast::Type_*>::operator->(&(this->super_Expression).type);
  bVar2 = Type::isClass(pTVar3);
  if (bVar2) {
    local_24 = 0x5000c;
    pSVar1 = &(this->super_Expression).sourceRange;
    local_38 = pSVar1->startLoc;
    local_30 = (this->super_Expression).sourceRange.endLoc;
    EvalContext::addDiag(local_20,(DiagCode)0x5000c,*pSVar1);
    this_local._7_1_ = false;
  }
  else {
    pTVar3 = not_null<const_slang::ast::Type_*>::operator->(&(this->super_Expression).type);
    bVar2 = Type::isCovergroup(pTVar3);
    if (bVar2) {
      local_3c = 0x6000c;
      pSVar1 = &(this->super_Expression).sourceRange;
      local_50 = pSVar1->startLoc;
      local_48 = (this->super_Expression).sourceRange.endLoc;
      EvalContext::addDiag(local_20,(DiagCode)0x6000c,*pSVar1);
      this_local._7_1_ = false;
    }
    else {
      local_71 = 0;
      if ((this->symbol->super_Symbol).kind == Specparam) {
        this_00 = &local_20->flags;
        bitmask<slang::ast::EvalFlags>::bitmask(&local_51,SpecparamsAllowed);
        bVar2 = bitmask<slang::ast::EvalFlags>::has(this_00,&local_51);
        local_71 = bVar2 ^ 0xff;
      }
      if ((local_71 & 1) == 0) {
        this_local._7_1_ = true;
      }
      else {
        EvalContext::addDiag(local_20,(DiagCode)0x860007,(this->super_Expression).sourceRange);
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ValueExpressionBase::checkConstantBase(EvalContext& context) const {
    // Class types are disallowed in constant expressions. Note that I don't see anything
    // in the spec that would explicitly disallow them, but literally every tool issues
    // an error so for now we will follow suit.
    if (type->isClass()) {
        context.addDiag(diag::ConstEvalClassType, sourceRange);
        return false;
    }

    // Same for covergroups.
    if (type->isCovergroup()) {
        context.addDiag(diag::ConstEvalCovergroupType, sourceRange);
        return false;
    }

    if (symbol.kind == SymbolKind::Specparam && !context.flags.has(EvalFlags::SpecparamsAllowed)) {
        context.addDiag(diag::SpecparamInConstant, sourceRange);
        return false;
    }

    return true;
}